

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O3

void append_file(CHAR_DATA *ch,char *file,char *str)

{
  bool bVar1;
  FILE *__stream;
  char *__src;
  int *piVar2;
  ulong uVar3;
  string_view fmt;
  char buf [4608];
  char *local_1230;
  char *local_1228 [576];
  
  local_1230 = file;
  bVar1 = is_npc(ch);
  if ((!bVar1) && (*str != '\0')) {
    fclose((FILE *)fpReserve);
    __stream = fopen(file,"a");
    if (__stream == (FILE *)0x0) {
      piVar2 = __errno_location();
      local_1228[0] = strerror(*piVar2);
      fmt._M_str = "Append_file: fopen {}: {}";
      fmt._M_len = 0x19;
      CLogger::Warn<char*&,char*>((CLogger *)&RS.field_0x140,fmt,&local_1230,local_1228);
      send_to_char("Could not open the file!\n\r",ch);
    }
    else {
      __src = ctime(&current_time);
      strcpy((char *)local_1228,__src);
      chop((char *)local_1228);
      if (ch->in_room == (ROOM_INDEX_DATA *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = (ulong)(uint)(int)ch->in_room->vnum;
      }
      fprintf(__stream,"[%5d] %s: %s: %s\n",uVar3,ch->true_name,local_1228,str);
      fclose(__stream);
    }
    fpReserve = (FILE *)fopen("/dev/null","r");
  }
  return;
}

Assistant:

void append_file(CHAR_DATA *ch, char *file, char *str)
{
	FILE *fp;
	char buf[MSL];

	if (is_npc(ch) || str[0] == '\0')
		return;

	fclose(fpReserve);

	fp = fopen(file, "a");

	if (fp == nullptr)
	{
		RS.Logger.Warn("Append_file: fopen {}: {}", file, std::strerror(errno));
		send_to_char("Could not open the file!\n\r", ch);
	}
	else
	{
		// free_pstring(buf);
		strcpy(buf, ctime(&current_time));
		chop(buf);
		fprintf(fp, "[%5d] %s: %s: %s\n", ch->in_room ? ch->in_room->vnum : 0, ch->true_name, buf, str);
		fclose(fp);
	}

	fpReserve = fopen(NULL_FILE, "r");
}